

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_color_config(SequenceHeader *seq_params,aom_write_bit_buffer *wb)

{
  uint bit;
  SequenceHeader *in_RSI;
  long in_RDI;
  int is_monochrome;
  int in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  write_bitdepth(in_RSI,(aom_write_bit_buffer *)
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  bit = (uint)*(byte *)(in_RDI + 0x4d);
  if (*(char *)(in_RDI + 0x45) != '\x01') {
    aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,bit);
  }
  if (((*(int *)(in_RDI + 0x50) == 2) && (*(int *)(in_RDI + 0x54) == 2)) &&
     (*(int *)(in_RDI + 0x58) == 2)) {
    aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,0);
  }
  else {
    aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,1);
    aom_wb_write_literal((aom_write_bit_buffer *)in_RSI,bit,in_stack_ffffffffffffffe8);
    aom_wb_write_literal((aom_write_bit_buffer *)in_RSI,bit,in_stack_ffffffffffffffe8);
    aom_wb_write_literal((aom_write_bit_buffer *)in_RSI,bit,in_stack_ffffffffffffffe8);
  }
  if (bit == 0) {
    if (((*(int *)(in_RDI + 0x50) != 1) || (*(int *)(in_RDI + 0x54) != 0xd)) ||
       (*(int *)(in_RDI + 0x58) != 0)) {
      aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,*(int *)(in_RDI + 0x5c));
      if (((*(char *)(in_RDI + 0x45) != '\0') && (*(char *)(in_RDI + 0x45) != '\x01')) &&
         ((*(char *)(in_RDI + 0x45) == '\x02' &&
          ((*(int *)(in_RDI + 0x48) == 0xc &&
           (aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,*(int *)(in_RDI + 0x60)),
           *(int *)(in_RDI + 0x60) != 0)))))) {
        aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,*(int *)(in_RDI + 100));
      }
      if ((*(int *)(in_RDI + 0x60) == 1) && (*(int *)(in_RDI + 100) == 1)) {
        aom_wb_write_literal((aom_write_bit_buffer *)in_RSI,bit,in_stack_ffffffffffffffe8);
      }
    }
    aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,(uint)*(byte *)(in_RDI + 0x6c));
  }
  else {
    aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,*(int *)(in_RDI + 0x5c));
  }
  return;
}

Assistant:

static inline void write_color_config(const SequenceHeader *const seq_params,
                                      struct aom_write_bit_buffer *wb) {
  write_bitdepth(seq_params, wb);
  const int is_monochrome = seq_params->monochrome;
  // monochrome bit
  if (seq_params->profile != PROFILE_1)
    aom_wb_write_bit(wb, is_monochrome);
  else
    assert(!is_monochrome);
  if (seq_params->color_primaries == AOM_CICP_CP_UNSPECIFIED &&
      seq_params->transfer_characteristics == AOM_CICP_TC_UNSPECIFIED &&
      seq_params->matrix_coefficients == AOM_CICP_MC_UNSPECIFIED) {
    aom_wb_write_bit(wb, 0);  // No color description present
  } else {
    aom_wb_write_bit(wb, 1);  // Color description present
    aom_wb_write_literal(wb, seq_params->color_primaries, 8);
    aom_wb_write_literal(wb, seq_params->transfer_characteristics, 8);
    aom_wb_write_literal(wb, seq_params->matrix_coefficients, 8);
  }
  if (is_monochrome) {
    // 0: [16, 235] (i.e. xvYCC), 1: [0, 255]
    aom_wb_write_bit(wb, seq_params->color_range);
    return;
  }
  if (seq_params->color_primaries == AOM_CICP_CP_BT_709 &&
      seq_params->transfer_characteristics == AOM_CICP_TC_SRGB &&
      seq_params->matrix_coefficients == AOM_CICP_MC_IDENTITY) {
    assert(seq_params->subsampling_x == 0 && seq_params->subsampling_y == 0);
    assert(seq_params->profile == PROFILE_1 ||
           (seq_params->profile == PROFILE_2 &&
            seq_params->bit_depth == AOM_BITS_12));
  } else {
    // 0: [16, 235] (i.e. xvYCC), 1: [0, 255]
    aom_wb_write_bit(wb, seq_params->color_range);
    if (seq_params->profile == PROFILE_0) {
      // 420 only
      assert(seq_params->subsampling_x == 1 && seq_params->subsampling_y == 1);
    } else if (seq_params->profile == PROFILE_1) {
      // 444 only
      assert(seq_params->subsampling_x == 0 && seq_params->subsampling_y == 0);
    } else if (seq_params->profile == PROFILE_2) {
      if (seq_params->bit_depth == AOM_BITS_12) {
        // 420, 444 or 422
        aom_wb_write_bit(wb, seq_params->subsampling_x);
        if (seq_params->subsampling_x == 0) {
          assert(seq_params->subsampling_y == 0 &&
                 "4:4:0 subsampling not allowed in AV1");
        } else {
          aom_wb_write_bit(wb, seq_params->subsampling_y);
        }
      } else {
        // 422 only
        assert(seq_params->subsampling_x == 1 &&
               seq_params->subsampling_y == 0);
      }
    }
    if (seq_params->matrix_coefficients == AOM_CICP_MC_IDENTITY) {
      assert(seq_params->subsampling_x == 0 && seq_params->subsampling_y == 0);
    }
    if (seq_params->subsampling_x == 1 && seq_params->subsampling_y == 1) {
      aom_wb_write_literal(wb, seq_params->chroma_sample_position, 2);
    }
  }
  aom_wb_write_bit(wb, seq_params->separate_uv_delta_q);
}